

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::flatten_buffer_block(CompilerGLSL *this,VariableID id)

{
  SPIRVariable *pSVar1;
  SPIRType *pSVar2;
  Bitset *pBVar3;
  CompilerError *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string name;
  
  pSVar1 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,id.id);
  pSVar2 = Compiler::get<spirv_cross::SPIRType>
                     (&this->super_Compiler,*(uint32_t *)&(pSVar1->super_IVariant).field_0xc);
  (*(this->super_Compiler)._vptr_Compiler[6])(&name,this,(ulong)(pSVar2->super_IVariant).self.id,0);
  pBVar3 = Compiler::get_decoration_bitset
                     (&this->super_Compiler,(ID)(pSVar2->super_IVariant).self.id);
  if ((pSVar2->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_58,&name," is an array of UBOs.");
    CompilerError::CompilerError(pCVar4,&local_58);
    __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(int *)&(pSVar2->super_IVariant).field_0xc != 0xf) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_58,&name," is not a struct.");
    CompilerError::CompilerError(pCVar4,&local_58);
    __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((pBVar3->lower & 4) == 0) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_58,&name," is not a block.");
    CompilerError::CompilerError(pCVar4,&local_58);
    __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((pSVar2->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size != 0) {
    local_58._M_dataplus._M_p._0_4_ = id.id;
    ::std::__detail::
    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&this->flattened_buffer_blocks,(value_type *)&local_58);
    ::std::__cxx11::string::~string((string *)&name);
    return;
  }
  pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_58,&name," is an empty struct.");
  CompilerError::CompilerError(pCVar4,&local_58);
  __cxa_throw(pCVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::flatten_buffer_block(VariableID id)
{
	auto &var = get<SPIRVariable>(id);
	auto &type = get<SPIRType>(var.basetype);
	auto name = to_name(type.self, false);
	auto &flags = get_decoration_bitset(type.self);

	if (!type.array.empty())
		SPIRV_CROSS_THROW(name + " is an array of UBOs.");
	if (type.basetype != SPIRType::Struct)
		SPIRV_CROSS_THROW(name + " is not a struct.");
	if (!flags.get(DecorationBlock))
		SPIRV_CROSS_THROW(name + " is not a block.");
	if (type.member_types.empty())
		SPIRV_CROSS_THROW(name + " is an empty struct.");

	flattened_buffer_blocks.insert(id);
}